

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitstreamDecoder.cpp
# Opt level: O0

void scan_flux_gcr(TrackData *trackdata)

{
  FluxData *flux_revs;
  undefined1 local_c0 [8];
  BitBuffer bitbuf;
  FluxDecoder decoder;
  int bitcell_ns;
  TrackData *trackdata_local;
  
  if ((trackdata->cylhead).cyl < 0x11) {
    decoder.m_index = true;
    decoder.m_sync_lost = true;
    decoder._62_2_ = 0;
  }
  else if ((trackdata->cylhead).cyl < 0x18) {
    decoder.m_index = true;
    decoder.m_sync_lost = true;
    decoder._62_2_ = 0;
  }
  else if ((trackdata->cylhead).cyl < 0x1e) {
    decoder.m_index = true;
    decoder.m_sync_lost = true;
    decoder._62_2_ = 0;
  }
  else {
    decoder.m_index = true;
    decoder.m_sync_lost = true;
    decoder._62_2_ = 0;
  }
  flux_revs = TrackData::flux(trackdata);
  FluxDecoder::FluxDecoder((FluxDecoder *)&bitbuf.m_wrapped,flux_revs,decoder._60_4_,opt.scale,4);
  BitBuffer::BitBuffer((BitBuffer *)local_c0,_250K,(FluxDecoder *)&bitbuf.m_wrapped);
  TrackData::add(trackdata,(BitBuffer *)local_c0);
  scan_bitstream_gcr(trackdata);
  BitBuffer::~BitBuffer((BitBuffer *)local_c0);
  return;
}

Assistant:

void scan_flux_gcr(TrackData& trackdata)
{
    int bitcell_ns;

    // C64 GCR disks are zoned, with variable rate depending on cylinder
    if (trackdata.cylhead.cyl < 17)
        bitcell_ns = 3200;
    else if (trackdata.cylhead.cyl < 24)
        bitcell_ns = 3500;
    else if (trackdata.cylhead.cyl < 30)
        bitcell_ns = 3750;
    else
        bitcell_ns = 4000;

    FluxDecoder decoder(trackdata.flux(), bitcell_ns, opt.scale);
    BitBuffer bitbuf(DataRate::_250K, decoder);

    trackdata.add(std::move(bitbuf));
    scan_bitstream_gcr(trackdata);
}